

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to16.h
# Opt level: O3

void ncnn::im2col_sgemm_pack1to16_avx512
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined4 uVar1;
  undefined1 auVar2 [64];
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  int *piVar14;
  uint uVar15;
  _func_int ***ppp_Var16;
  undefined4 *puVar17;
  ulong uVar18;
  uint uVar19;
  undefined1 (*pauVar20) [64];
  int nn;
  int iVar21;
  ulong uVar22;
  long lVar23;
  undefined4 *puVar24;
  void **ppvVar25;
  ulong uVar26;
  long lVar27;
  undefined1 (*pauVar28) [64];
  uint uVar29;
  char cVar30;
  uint uVar31;
  ulong uVar32;
  undefined1 (*pauVar33) [16];
  undefined1 (*pauVar34) [32];
  undefined4 *puVar35;
  int iVar36;
  long lVar37;
  int iVar38;
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  float zeros [16];
  undefined1 local_d8 [64];
  size_t local_98;
  ulong local_90;
  Mat *local_88;
  Allocator *local_80;
  void *local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uVar3 = bottom_im2col->w;
  uVar22 = (ulong)(int)uVar3;
  iVar21 = bottom_im2col->h;
  uVar29 = bottom_im2col->c;
  uVar18 = (ulong)uVar29;
  local_90 = (ulong)(uint)top_blob->c;
  local_98 = 0;
  local_d8._0_8_ = (Allocator *)0x0;
  local_d8._8_4_ = 0;
  local_d8._12_4_ = 0;
  local_d8._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_d8._24_4_ = 0;
  local_d8._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  if ((long)uVar22 < 8) {
    uVar15 = uVar3;
    iVar36 = iVar21;
    if (3 < (int)uVar3) {
      iVar36 = iVar21 * 4;
      uVar15 = (uVar3 & 3) + 1;
    }
  }
  else {
    uVar15 = (uVar3 & 3) + (uVar3 >> 3) + (uint)((uVar3 >> 2 & 1) != 0);
    iVar36 = iVar21 * 8;
  }
  local_d8._32_8_ = local_d8._0_8_;
  local_d8._40_4_ = local_d8._8_4_;
  local_d8._44_4_ = local_d8._12_4_;
  local_88 = _bias;
  Mat::create((Mat *)local_d8,iVar36,uVar29,uVar15,4,1,(Allocator *)opt);
  uVar15 = (int)uVar3 >> 3;
  if (0 < (int)uVar15) {
    lVar23 = 0;
    uVar26 = 0;
    do {
      if (0 < (int)uVar29) {
        ppp_Var16 = (_func_int ***)
                    ((long)(_func_int ***)local_d8._0_8_ + local_98 * uVar26 * local_d8._16_8_);
        uVar32 = 0;
        do {
          if (0 < iVar21) {
            pauVar34 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar32 + lVar23);
            iVar36 = iVar21;
            do {
              *(undefined1 (*) [32])ppp_Var16 = *pauVar34;
              ppp_Var16 = ppp_Var16 + 4;
              pauVar34 = (undefined1 (*) [32])(*pauVar34 + (ulong)uVar3 * 4);
              iVar36 = iVar36 + -1;
            } while (iVar36 != 0);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar18);
      }
      uVar26 = uVar26 + 1;
      lVar23 = lVar23 + 0x20;
    } while (uVar26 != uVar15);
  }
  uVar19 = uVar3 >> 2 & 1;
  if ((uVar19 != 0) && (0 < (int)uVar29)) {
    ppp_Var16 = (_func_int ***)
                ((long)(_func_int ***)local_d8._0_8_ +
                (long)(int)uVar15 * local_98 * local_d8._16_8_);
    uVar26 = 0;
    do {
      if (0 < iVar21) {
        pauVar33 = (undefined1 (*) [16])
                   ((long)bottom_im2col->data +
                   bottom_im2col->cstep * bottom_im2col->elemsize * uVar26 +
                   (uVar22 & 0xfffffffffffffff8) * 4);
        iVar36 = iVar21;
        do {
          *(undefined1 (*) [16])ppp_Var16 = *pauVar33;
          ppp_Var16 = ppp_Var16 + 2;
          pauVar33 = (undefined1 (*) [16])(*pauVar33 + uVar22 * 4);
          iVar36 = iVar36 + -1;
        } while (iVar36 != 0);
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != uVar18);
  }
  iVar36 = (int)(uVar22 & 0xfffffffffffffff8) + uVar19 * 4;
  if (iVar36 < (int)uVar3) {
    local_80 = (Allocator *)local_d8._0_8_;
    lVar23 = (long)iVar36;
    puVar17 = (undefined4 *)(lVar23 * 4 + (long)bottom_im2col->data);
    sVar4 = bottom_im2col->cstep;
    sVar5 = bottom_im2col->elemsize;
    do {
      if (0 < (int)uVar29) {
        uVar15 = (uint)lVar23;
        uVar19 = uVar15 + 3;
        if (-1 < (int)uVar15) {
          uVar19 = uVar15;
        }
        uVar31 = uVar15 + 7;
        if (-1 < (int)uVar15) {
          uVar31 = uVar15;
        }
        cVar30 = (char)lVar23 - ((byte)uVar31 & 0xf8);
        ppp_Var16 = (_func_int ***)
                    ((long)(_func_int ***)local_d8._0_8_ +
                    (long)(int)((int)((char)(((byte)(cVar30 >> 7) >> 6) + cVar30) >> 2) +
                               ((int)uVar31 >> 3) + (uVar15 - (uVar19 & 0xfffffffc))) *
                    local_98 * local_d8._16_8_);
        uVar26 = 0;
        puVar24 = puVar17;
        do {
          puVar35 = puVar24;
          iVar36 = iVar21;
          if (0 < iVar21) {
            do {
              *(undefined4 *)ppp_Var16 = *puVar35;
              ppp_Var16 = (_func_int ***)((long)ppp_Var16 + 4);
              puVar35 = puVar35 + uVar22;
              iVar36 = iVar36 + -1;
            } while (iVar36 != 0);
          }
          uVar26 = uVar26 + 1;
          puVar24 = (undefined4 *)((long)puVar24 + sVar4 * sVar5);
        } while (uVar26 != uVar18);
      }
      lVar23 = lVar23 + 1;
      puVar17 = puVar17 + 1;
    } while (lVar23 < (long)uVar22);
  }
  if (0 < (int)local_90) {
    iVar21 = iVar21 * uVar29;
    uVar18 = 0;
    do {
      pauVar20 = (undefined1 (*) [64])
                 (top_blob->cstep * uVar18 * top_blob->elemsize + (long)top_blob->data);
      ppvVar25 = &local_88->data + uVar18 * 8;
      if (local_88 == (Mat *)0x0) {
        ppvVar25 = &local_78;
      }
      local_78 = (void *)0x0;
      uStack_70 = 0;
      uStack_68 = 0;
      uStack_60 = 0;
      uStack_58 = 0;
      uStack_50 = 0;
      uStack_48 = 0;
      uStack_40 = 0;
      if ((int)uVar3 < 8) {
        uVar26 = 0;
      }
      else {
        lVar23 = 0;
        uVar32 = 0;
        do {
          auVar46 = *(undefined1 (*) [64])ppvVar25;
          auVar45 = auVar46;
          auVar44 = auVar46;
          auVar43 = auVar46;
          auVar42 = auVar46;
          auVar41 = auVar46;
          auVar40 = auVar46;
          auVar39 = auVar46;
          if (0 < iVar21) {
            lVar27 = local_98 * local_d8._16_8_ * lVar23;
            lVar37 = 0;
            iVar36 = iVar21;
            do {
              auVar2 = *(undefined1 (*) [64])
                        ((long)kernel->data + lVar37 * 2 + kernel->cstep * uVar18 * kernel->elemsize
                        );
              uVar1 = *(undefined4 *)((long)(_func_int ***)local_d8._0_8_ + lVar37 + lVar27);
              auVar6._4_4_ = uVar1;
              auVar6._0_4_ = uVar1;
              auVar6._8_4_ = uVar1;
              auVar6._12_4_ = uVar1;
              auVar6._16_4_ = uVar1;
              auVar6._20_4_ = uVar1;
              auVar6._24_4_ = uVar1;
              auVar6._28_4_ = uVar1;
              auVar6._32_4_ = uVar1;
              auVar6._36_4_ = uVar1;
              auVar6._40_4_ = uVar1;
              auVar6._44_4_ = uVar1;
              auVar6._48_4_ = uVar1;
              auVar6._52_4_ = uVar1;
              auVar6._56_4_ = uVar1;
              auVar6._60_4_ = uVar1;
              auVar39 = vfmadd231ps_avx512f(auVar39,auVar2,auVar6);
              uVar1 = *(undefined4 *)((long)(_func_int ***)local_d8._0_8_ + lVar37 + lVar27 + 4);
              auVar7._4_4_ = uVar1;
              auVar7._0_4_ = uVar1;
              auVar7._8_4_ = uVar1;
              auVar7._12_4_ = uVar1;
              auVar7._16_4_ = uVar1;
              auVar7._20_4_ = uVar1;
              auVar7._24_4_ = uVar1;
              auVar7._28_4_ = uVar1;
              auVar7._32_4_ = uVar1;
              auVar7._36_4_ = uVar1;
              auVar7._40_4_ = uVar1;
              auVar7._44_4_ = uVar1;
              auVar7._48_4_ = uVar1;
              auVar7._52_4_ = uVar1;
              auVar7._56_4_ = uVar1;
              auVar7._60_4_ = uVar1;
              auVar40 = vfmadd231ps_avx512f(auVar40,auVar2,auVar7);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)(local_d8._0_8_ + 8))->_vptr_Allocator +
                       lVar37 + lVar27);
              auVar8._4_4_ = uVar1;
              auVar8._0_4_ = uVar1;
              auVar8._8_4_ = uVar1;
              auVar8._12_4_ = uVar1;
              auVar8._16_4_ = uVar1;
              auVar8._20_4_ = uVar1;
              auVar8._24_4_ = uVar1;
              auVar8._28_4_ = uVar1;
              auVar8._32_4_ = uVar1;
              auVar8._36_4_ = uVar1;
              auVar8._40_4_ = uVar1;
              auVar8._44_4_ = uVar1;
              auVar8._48_4_ = uVar1;
              auVar8._52_4_ = uVar1;
              auVar8._56_4_ = uVar1;
              auVar8._60_4_ = uVar1;
              auVar41 = vfmadd231ps_avx512f(auVar41,auVar2,auVar8);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)(local_d8._0_8_ + 8))->_vptr_Allocator +
                       lVar37 + lVar27 + 4);
              auVar9._4_4_ = uVar1;
              auVar9._0_4_ = uVar1;
              auVar9._8_4_ = uVar1;
              auVar9._12_4_ = uVar1;
              auVar9._16_4_ = uVar1;
              auVar9._20_4_ = uVar1;
              auVar9._24_4_ = uVar1;
              auVar9._28_4_ = uVar1;
              auVar9._32_4_ = uVar1;
              auVar9._36_4_ = uVar1;
              auVar9._40_4_ = uVar1;
              auVar9._44_4_ = uVar1;
              auVar9._48_4_ = uVar1;
              auVar9._52_4_ = uVar1;
              auVar9._56_4_ = uVar1;
              auVar9._60_4_ = uVar1;
              auVar42 = vfmadd231ps_avx512f(auVar42,auVar2,auVar9);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)(local_d8._0_8_ + 0x10))->_vptr_Allocator +
                       lVar37 + lVar27);
              auVar10._4_4_ = uVar1;
              auVar10._0_4_ = uVar1;
              auVar10._8_4_ = uVar1;
              auVar10._12_4_ = uVar1;
              auVar10._16_4_ = uVar1;
              auVar10._20_4_ = uVar1;
              auVar10._24_4_ = uVar1;
              auVar10._28_4_ = uVar1;
              auVar10._32_4_ = uVar1;
              auVar10._36_4_ = uVar1;
              auVar10._40_4_ = uVar1;
              auVar10._44_4_ = uVar1;
              auVar10._48_4_ = uVar1;
              auVar10._52_4_ = uVar1;
              auVar10._56_4_ = uVar1;
              auVar10._60_4_ = uVar1;
              auVar43 = vfmadd231ps_avx512f(auVar43,auVar2,auVar10);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)(local_d8._0_8_ + 0x10))->_vptr_Allocator +
                       lVar37 + lVar27 + 4);
              auVar11._4_4_ = uVar1;
              auVar11._0_4_ = uVar1;
              auVar11._8_4_ = uVar1;
              auVar11._12_4_ = uVar1;
              auVar11._16_4_ = uVar1;
              auVar11._20_4_ = uVar1;
              auVar11._24_4_ = uVar1;
              auVar11._28_4_ = uVar1;
              auVar11._32_4_ = uVar1;
              auVar11._36_4_ = uVar1;
              auVar11._40_4_ = uVar1;
              auVar11._44_4_ = uVar1;
              auVar11._48_4_ = uVar1;
              auVar11._52_4_ = uVar1;
              auVar11._56_4_ = uVar1;
              auVar11._60_4_ = uVar1;
              auVar44 = vfmadd231ps_avx512f(auVar44,auVar2,auVar11);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)(local_d8._0_8_ + 0x18))->_vptr_Allocator +
                       lVar37 + lVar27);
              auVar12._4_4_ = uVar1;
              auVar12._0_4_ = uVar1;
              auVar12._8_4_ = uVar1;
              auVar12._12_4_ = uVar1;
              auVar12._16_4_ = uVar1;
              auVar12._20_4_ = uVar1;
              auVar12._24_4_ = uVar1;
              auVar12._28_4_ = uVar1;
              auVar12._32_4_ = uVar1;
              auVar12._36_4_ = uVar1;
              auVar12._40_4_ = uVar1;
              auVar12._44_4_ = uVar1;
              auVar12._48_4_ = uVar1;
              auVar12._52_4_ = uVar1;
              auVar12._56_4_ = uVar1;
              auVar12._60_4_ = uVar1;
              auVar45 = vfmadd231ps_avx512f(auVar45,auVar2,auVar12);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)(local_d8._0_8_ + 0x18))->_vptr_Allocator +
                       lVar37 + lVar27 + 4);
              auVar13._4_4_ = uVar1;
              auVar13._0_4_ = uVar1;
              auVar13._8_4_ = uVar1;
              auVar13._12_4_ = uVar1;
              auVar13._16_4_ = uVar1;
              auVar13._20_4_ = uVar1;
              auVar13._24_4_ = uVar1;
              auVar13._28_4_ = uVar1;
              auVar13._32_4_ = uVar1;
              auVar13._36_4_ = uVar1;
              auVar13._40_4_ = uVar1;
              auVar13._44_4_ = uVar1;
              auVar13._48_4_ = uVar1;
              auVar13._52_4_ = uVar1;
              auVar13._56_4_ = uVar1;
              auVar13._60_4_ = uVar1;
              auVar46 = vfmadd231ps_avx512f(auVar46,auVar2,auVar13);
              lVar37 = lVar37 + 0x20;
              iVar36 = iVar36 + -1;
            } while (iVar36 != 0);
          }
          *pauVar20 = auVar39;
          pauVar20[1] = auVar40;
          pauVar20[2] = auVar41;
          pauVar20[3] = auVar42;
          pauVar20[4] = auVar43;
          pauVar20[5] = auVar44;
          pauVar20[6] = auVar45;
          pauVar20[7] = auVar46;
          pauVar20 = pauVar20 + 8;
          uVar26 = uVar32 + 8;
          lVar27 = uVar32 + 0xf;
          lVar23 = lVar23 + 1;
          uVar32 = uVar26;
        } while (lVar27 < (long)uVar22);
      }
      if ((int)((uint)uVar26 | 3) < (int)uVar3) {
        uVar29 = 0;
        do {
          auVar46 = *(undefined1 (*) [64])ppvVar25;
          iVar36 = (int)uVar26;
          auVar45 = auVar46;
          auVar44 = auVar46;
          auVar43 = auVar46;
          if (0 < iVar21) {
            lVar23 = local_98 * local_d8._16_8_ *
                     (ulong)((uVar29 & 1) + ((uint)(uVar26 >> 3) & 0x1fffffff));
            lVar27 = 0;
            iVar38 = iVar21;
            do {
              auVar42 = *(undefined1 (*) [64])
                         ((long)kernel->data +
                         lVar27 * 4 + kernel->cstep * uVar18 * kernel->elemsize);
              uVar1 = *(undefined4 *)((long)(_func_int ***)local_d8._0_8_ + lVar27 + lVar23);
              auVar41._4_4_ = uVar1;
              auVar41._0_4_ = uVar1;
              auVar41._8_4_ = uVar1;
              auVar41._12_4_ = uVar1;
              auVar41._16_4_ = uVar1;
              auVar41._20_4_ = uVar1;
              auVar41._24_4_ = uVar1;
              auVar41._28_4_ = uVar1;
              auVar41._32_4_ = uVar1;
              auVar41._36_4_ = uVar1;
              auVar41._40_4_ = uVar1;
              auVar41._44_4_ = uVar1;
              auVar41._48_4_ = uVar1;
              auVar41._52_4_ = uVar1;
              auVar41._56_4_ = uVar1;
              auVar41._60_4_ = uVar1;
              auVar43 = vfmadd231ps_avx512f(auVar43,auVar42,auVar41);
              uVar1 = *(undefined4 *)((long)(_func_int ***)local_d8._0_8_ + lVar27 + lVar23 + 4);
              auVar40._4_4_ = uVar1;
              auVar40._0_4_ = uVar1;
              auVar40._8_4_ = uVar1;
              auVar40._12_4_ = uVar1;
              auVar40._16_4_ = uVar1;
              auVar40._20_4_ = uVar1;
              auVar40._24_4_ = uVar1;
              auVar40._28_4_ = uVar1;
              auVar40._32_4_ = uVar1;
              auVar40._36_4_ = uVar1;
              auVar40._40_4_ = uVar1;
              auVar40._44_4_ = uVar1;
              auVar40._48_4_ = uVar1;
              auVar40._52_4_ = uVar1;
              auVar40._56_4_ = uVar1;
              auVar40._60_4_ = uVar1;
              auVar44 = vfmadd231ps_avx512f(auVar44,auVar42,auVar40);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)(local_d8._0_8_ + 8))->_vptr_Allocator +
                       lVar27 + lVar23);
              auVar39._4_4_ = uVar1;
              auVar39._0_4_ = uVar1;
              auVar39._8_4_ = uVar1;
              auVar39._12_4_ = uVar1;
              auVar39._16_4_ = uVar1;
              auVar39._20_4_ = uVar1;
              auVar39._24_4_ = uVar1;
              auVar39._28_4_ = uVar1;
              auVar39._32_4_ = uVar1;
              auVar39._36_4_ = uVar1;
              auVar39._40_4_ = uVar1;
              auVar39._44_4_ = uVar1;
              auVar39._48_4_ = uVar1;
              auVar39._52_4_ = uVar1;
              auVar39._56_4_ = uVar1;
              auVar39._60_4_ = uVar1;
              auVar45 = vfmadd231ps_avx512f(auVar45,auVar42,auVar39);
              uVar1 = *(undefined4 *)
                       ((long)&((Allocator *)(local_d8._0_8_ + 8))->_vptr_Allocator +
                       lVar27 + lVar23 + 4);
              auVar2._4_4_ = uVar1;
              auVar2._0_4_ = uVar1;
              auVar2._8_4_ = uVar1;
              auVar2._12_4_ = uVar1;
              auVar2._16_4_ = uVar1;
              auVar2._20_4_ = uVar1;
              auVar2._24_4_ = uVar1;
              auVar2._28_4_ = uVar1;
              auVar2._32_4_ = uVar1;
              auVar2._36_4_ = uVar1;
              auVar2._40_4_ = uVar1;
              auVar2._44_4_ = uVar1;
              auVar2._48_4_ = uVar1;
              auVar2._52_4_ = uVar1;
              auVar2._56_4_ = uVar1;
              auVar2._60_4_ = uVar1;
              auVar46 = vfmadd231ps_avx512f(auVar46,auVar42,auVar2);
              lVar27 = lVar27 + 0x10;
              iVar38 = iVar38 + -1;
            } while (iVar38 != 0);
          }
          *pauVar20 = auVar43;
          pauVar20[1] = auVar44;
          pauVar20[2] = auVar45;
          pauVar20[3] = auVar46;
          pauVar20 = pauVar20 + 4;
          uVar26 = (ulong)(iVar36 + 4);
          uVar29 = (uint)(byte)((char)uVar29 + 1);
        } while (iVar36 + 7 < (int)uVar3);
      }
      else {
        uVar26 = uVar26 & 0xffffffff;
      }
      if ((int)uVar26 < (int)uVar3) {
        do {
          uVar29 = (uint)uVar26;
          auVar46 = *(undefined1 (*) [64])ppvVar25;
          if (0 < iVar21) {
            pauVar28 = (undefined1 (*) [64])
                       (kernel->cstep * uVar18 * kernel->elemsize + (long)kernel->data);
            lVar23 = 0;
            do {
              uVar1 = *(undefined4 *)
                       ((long)(_func_int ***)local_d8._0_8_ +
                       lVar23 * 4 +
                       local_98 * local_d8._16_8_ *
                       (ulong)((uVar29 & 3) + (int)(uVar26 >> 3) + (uint)((uVar29 >> 2 & 1) != 0)));
              auVar45._4_4_ = uVar1;
              auVar45._0_4_ = uVar1;
              auVar45._8_4_ = uVar1;
              auVar45._12_4_ = uVar1;
              auVar45._16_4_ = uVar1;
              auVar45._20_4_ = uVar1;
              auVar45._24_4_ = uVar1;
              auVar45._28_4_ = uVar1;
              auVar45._32_4_ = uVar1;
              auVar45._36_4_ = uVar1;
              auVar45._40_4_ = uVar1;
              auVar45._44_4_ = uVar1;
              auVar45._48_4_ = uVar1;
              auVar45._52_4_ = uVar1;
              auVar45._56_4_ = uVar1;
              auVar45._60_4_ = uVar1;
              auVar46 = vfmadd231ps_avx512f(auVar46,*pauVar28,auVar45);
              pauVar28 = pauVar28 + 1;
              lVar23 = lVar23 + 1;
            } while (iVar21 != (int)lVar23);
          }
          *pauVar20 = auVar46;
          pauVar20 = pauVar20 + 1;
          uVar26 = (ulong)(uVar29 + 1);
        } while (uVar29 + 1 != uVar3);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != local_90);
  }
  piVar14 = (int *)CONCAT44(local_d8._12_4_,local_d8._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if ((Allocator *)local_d8._32_8_ == (Allocator *)0x0) {
        if ((Allocator *)local_d8._0_8_ != (Allocator *)0x0) {
          free((void *)local_d8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_d8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack1to16_avx512(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 4u, 1, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 4u, 1, opt.workspace_allocator);
    {
        int nn_size = size >> 3;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256 _r0 = _mm256_loadu_ps(img0);
                    _mm256_store_ps(tmpptr, _r0);

                    img0 += size;
                    tmpptr += 8;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _r0 = _mm_loadu_ps(img0);
                    _mm_store_ps(tmpptr, _r0);

                    img0 += size;
                    tmpptr += 4;
                }
            }
        }

        remain_size_start += nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    img0 += size;
                    tmpptr += 1;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[16] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 16 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 8);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);
            __m512 _sum1 = _sum0;
            __m512 _sum2 = _sum0;
            __m512 _sum3 = _sum0;
            __m512 _sum4 = _sum0;
            __m512 _sum5 = _sum0;
            __m512 _sum6 = _sum0;
            __m512 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr0);

                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                __m512 _val1 = _mm512_set1_ps(tmpptr[1]);
                __m512 _val2 = _mm512_set1_ps(tmpptr[2]);
                __m512 _val3 = _mm512_set1_ps(tmpptr[3]);
                __m512 _val4 = _mm512_set1_ps(tmpptr[4]);
                __m512 _val5 = _mm512_set1_ps(tmpptr[5]);
                __m512 _val6 = _mm512_set1_ps(tmpptr[6]);
                __m512 _val7 = _mm512_set1_ps(tmpptr[7]);

                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm512_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm512_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm512_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm512_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm512_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm512_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm512_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr0 += 16;
            }

            _mm512_store_ps(outptr0, _sum0);
            _mm512_store_ps(outptr0 + 16, _sum1);
            _mm512_store_ps(outptr0 + 16 * 2, _sum2);
            _mm512_store_ps(outptr0 + 16 * 3, _sum3);
            _mm512_store_ps(outptr0 + 16 * 4, _sum4);
            _mm512_store_ps(outptr0 + 16 * 5, _sum5);
            _mm512_store_ps(outptr0 + 16 * 6, _sum6);
            _mm512_store_ps(outptr0 + 16 * 7, _sum7);
            outptr0 += 128;
        }
        for (; i + 3 < size; i += 4)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);
            __m512 _sum1 = _sum0;
            __m512 _sum2 = _sum0;
            __m512 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr0);

                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                __m512 _val1 = _mm512_set1_ps(tmpptr[1]);
                __m512 _val2 = _mm512_set1_ps(tmpptr[2]);
                __m512 _val3 = _mm512_set1_ps(tmpptr[3]);

                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm512_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm512_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm512_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr0 += 16;
            }

            _mm512_store_ps(outptr0, _sum0);
            _mm512_store_ps(outptr0 + 16, _sum1);
            _mm512_store_ps(outptr0 + 32, _sum2);
            _mm512_store_ps(outptr0 + 48, _sum3);
            outptr0 += 64;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m512 _sum = _mm512_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr0);
                __m512 _val = _mm512_set1_ps(tmpptr[0]);
                _sum = _mm512_fmadd_ps(_w0, _val, _sum);

                tmpptr += 1;
                kptr0 += 16;
            }

            _mm512_store_ps(outptr0, _sum);
            outptr0 += 16;
        }
    }
}